

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_32sto11u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_INT32 OVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  OPJ_BYTE *pOVar10;
  uint uVar11;
  
  uVar7 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      uVar11 = pSrc[uVar7];
      uVar9 = pSrc[uVar7 + 1];
      uVar1 = pSrc[uVar7 + 2];
      uVar2 = pSrc[uVar7 + 3];
      uVar3 = pSrc[uVar7 + 4];
      uVar4 = pSrc[uVar7 + 5];
      uVar5 = pSrc[uVar7 + 6];
      OVar6 = pSrc[uVar7 + 7];
      *pDst = (OPJ_BYTE)(uVar11 >> 3);
      pDst[1] = (byte)(uVar9 >> 6) | (byte)(uVar11 << 5);
      pDst[2] = (byte)(uVar1 >> 9) | (byte)(uVar9 << 2);
      pDst[3] = (OPJ_BYTE)(uVar1 >> 1);
      pDst[4] = (byte)(uVar2 >> 4) | (byte)(uVar1 << 7);
      pDst[5] = (byte)(uVar3 >> 7) | (byte)(uVar2 << 4);
      pDst[6] = (byte)(uVar4 >> 10) | (char)uVar3 * '\x02';
      pDst[7] = (OPJ_BYTE)(uVar4 >> 2);
      pDst[8] = (byte)(uVar5 >> 5) | (byte)(uVar4 << 6);
      pDst[9] = (byte)((uint)OVar6 >> 8) | (byte)(uVar5 << 3);
      pDst[10] = (OPJ_BYTE)OVar6;
      pDst = pDst + 0xb;
      uVar7 = uVar7 + 8;
    } while (uVar7 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    *pDst = (OPJ_BYTE)((uint)pSrc[uVar7] >> 3);
    uVar11 = pSrc[uVar7] & 7;
    uVar9 = (uint)(length & 7);
    if (uVar9 == 1) {
      pOVar10 = pDst + 1;
      sVar8 = 5;
    }
    else {
      pDst[1] = (byte)((uint)pSrc[uVar7 + 1] >> 6) | (byte)(uVar11 << 5);
      uVar11 = pSrc[uVar7 + 1] & 0x3f;
      if (uVar9 < 3) {
        pOVar10 = pDst + 2;
        sVar8 = 2;
      }
      else {
        pDst[2] = (byte)((uint)pSrc[uVar7 + 2] >> 9) | (byte)(uVar11 << 2);
        uVar11 = pSrc[uVar7 + 2];
        pDst[3] = (OPJ_BYTE)(uVar11 >> 1);
        uVar11 = uVar11 & 1;
        if (uVar9 == 3) {
          pOVar10 = pDst + 4;
          sVar8 = 7;
        }
        else {
          pDst[4] = (byte)((uint)pSrc[uVar7 + 3] >> 4) | (byte)(uVar11 << 7);
          uVar11 = pSrc[uVar7 + 3] & 0xf;
          if (uVar9 < 5) {
            pOVar10 = pDst + 5;
            sVar8 = 4;
          }
          else {
            pDst[5] = (byte)((uint)pSrc[uVar7 + 4] >> 7) | (byte)(uVar11 << 4);
            uVar11 = pSrc[uVar7 + 4] & 0x7f;
            if (uVar9 == 5) {
              pOVar10 = pDst + 6;
              sVar8 = 1;
            }
            else {
              pDst[6] = (byte)((uint)pSrc[uVar7 + 5] >> 10) | (char)uVar11 * '\x02';
              uVar11 = pSrc[uVar7 + 5];
              pDst[7] = (OPJ_BYTE)(uVar11 >> 2);
              uVar11 = uVar11 & 3;
              if (uVar9 == 7) {
                pDst[8] = (byte)((uint)pSrc[uVar7 + 6] >> 5) | (byte)(uVar11 << 6);
                uVar11 = pSrc[uVar7 + 6] & 0x1f;
                pOVar10 = pDst + 9;
                sVar8 = 3;
              }
              else {
                pOVar10 = pDst + 8;
                sVar8 = 6;
              }
            }
          }
        }
      }
    }
    *pOVar10 = (OPJ_BYTE)(uVar11 << sVar8);
  }
  return;
}

Assistant:

static void tif_32sto11u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 >> 3));
        *pDst++ = (OPJ_BYTE)((src0 << 5) | (src1 >> 6));
        *pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 9));
        *pDst++ = (OPJ_BYTE)((src2 >> 1));
        *pDst++ = (OPJ_BYTE)((src2 << 7) | (src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 7));
        *pDst++ = (OPJ_BYTE)((src4 << 1) | (src5 >> 10));
        *pDst++ = (OPJ_BYTE)((src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 5));
        *pDst++ = (OPJ_BYTE)((src6 << 3) | (src7 >> 8));
        *pDst++ = (OPJ_BYTE)(src7);
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS2((OPJ_UINT32)pSrc[i + 0], 11)
        if (length > 1U) {
            PUTBITS2((OPJ_UINT32)pSrc[i + 1], 11)
            if (length > 2U) {
                PUTBITS2((OPJ_UINT32)pSrc[i + 2], 11)
                if (length > 3U) {
                    PUTBITS2((OPJ_UINT32)pSrc[i + 3], 11)
                    if (length > 4U) {
                        PUTBITS2((OPJ_UINT32)pSrc[i + 4], 11)
                        if (length > 5U) {
                            PUTBITS2((OPJ_UINT32)pSrc[i + 5], 11)
                            if (length > 6U) {
                                PUTBITS2((OPJ_UINT32)pSrc[i + 6], 11)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}